

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *pGVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer pcVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  cmGraphEdge *ni;
  pointer piVar10;
  pointer pcVar11;
  bool bVar12;
  int head;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  int local_cc;
  ulong local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  ulong local_a8;
  cmComputeComponentGraph *local_a0;
  Graph *local_98;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pGVar1 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  local_98 = pGVar1;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b8 = &this->ComponentHead;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b8,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b0 = &this->ComponentTail;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b0,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar8 = (int)((long)(ccg->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ccg->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  bVar12 = (int)uVar8 < 1;
  if (0 < (int)uVar8) {
    local_c0 = &ccg->TarjanComponents;
    local_c8 = (ulong)(uVar8 & 0x7fffffff);
    uVar9 = 0;
    do {
      local_cc = -1;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar2 = (ccg->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                &pcVar2[uVar9].super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      for (piVar10 = *(pointer *)
                      ((long)&pcVar2[uVar9].super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          piVar10 != piVar3; piVar10 = piVar10 + -1) {
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = IntraComponent(this,local_c0,(int)uVar9,piVar10[-1],&local_cc,
                               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_90);
        if (bVar7) {
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_90);
        }
        else {
          ComplainAboutBadComponent(this,ccg,(int)uVar9,true);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_90);
          if (!bVar7) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_60);
            return bVar12;
          }
        }
      }
      (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = local_cc;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      uVar9 = uVar9 + 1;
      bVar12 = local_c8 <= uVar9;
    } while (uVar9 != local_c8);
  }
  pGVar1 = local_98;
  uVar8 = (int)((long)(ccg->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ccg->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar8) {
    local_a8 = (ulong)(uVar8 & 0x7fffffff);
    local_c8 = 0;
    local_a0 = ccg;
    do {
      pvVar6 = local_b8;
      pcVar4 = (local_a0->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar11 = *(pointer *)
                 &pcVar4[local_c8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar5 = *(pointer *)
                ((long)&pcVar4[local_c8].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar11 != pcVar5) {
        local_c0 = (vector<int,_std::allocator<int>_> *)
                   ((long)(local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[local_c8] * 0x18);
        do {
          local_60._M_impl._0_4_ =
               (pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar11->Dest];
          local_90._M_impl._0_1_ = pcVar11->Strong;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((long)&(((pGVar1->
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> +
                     (long)local_c0),(int *)&local_60,(bool *)&local_90,&pcVar11->Backtrace);
          pcVar11 = pcVar11 + 1;
        } while (pcVar11 != pcVar5);
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 != local_a8);
  }
  return bVar12;
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (int ni : cmReverseRange(nl)) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      int dependee_component = ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.GetBacktrace());
    }
  }
  return true;
}